

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O2

void showmem(void)

{
  rusage rusage;
  rusage rStack_98;
  
  memset(&rStack_98,0,0x90);
  getrusage(RUSAGE_SELF,&rStack_98);
  fprintf(_stderr,"maxrss: %ld KB\n",rStack_98.ru_maxrss);
  return;
}

Assistant:

static void showmem(void)
{
#ifdef HAVE_GETRUSAGE
	struct rusage rusage;
	memset(&rusage, 0, sizeof(rusage));
	getrusage(RUSAGE_SELF, &rusage);
	fprintf(stderr, "maxrss: %ld KB\n", rusage.ru_maxrss);
#endif
}